

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMap.cpp
# Opt level: O1

error<idx2::mmap_err_code> idx2::CloseFile(mmap_file *MMap)

{
  long lVar1;
  int iVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  long *in_FS_OFFSET;
  error<idx2::mmap_err_code> eVar5;
  
  iVar2 = close(MMap->File);
  if (iVar2 == -1) {
    uVar4 = 0xe;
    uVar3 = 0xc1;
    lVar1 = *in_FS_OFFSET;
  }
  else {
    lVar1 = *in_FS_OFFSET;
    (MMap->Buf).Data = (byte *)0x0;
    (MMap->Buf).Bytes = 0;
    uVar3 = 0xc5;
    uVar4 = 0;
  }
  *(char **)(lVar1 + -0x480) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/MemoryMap.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x280) = uVar3;
  eVar5.Code = (int)uVar4;
  eVar5.StackIdx = (char)((ulong)uVar4 >> 0x20);
  eVar5.StrGened = (bool)(char)((ulong)uVar4 >> 0x28);
  eVar5._14_2_ = (short)((ulong)uVar4 >> 0x30);
  eVar5.Msg = "";
  return eVar5;
}

Assistant:

error<mmap_err_code>
CloseFile(mmap_file* MMap)
{
#if defined(_WIN32)
  if (!CloseHandle(MMap->File))
    return idx2_Error(mmap_err_code::FileCloseFailed);
#elif defined(__CYGWIN__) || defined(__linux__) || defined(__APPLE__)
  if (close(MMap->File) == -1)
    return idx2_Error(mmap_err_code::FileCloseFailed);
#endif
  MMap->Buf.Data = nullptr;
  MMap->Buf.Bytes = 0;
  return idx2_Error(mmap_err_code::NoError);
}